

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  pointer __dest;
  uint8_t *puVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int extraout_EDX;
  char *pcVar5;
  CodedInputStream *this_00;
  int iVar6;
  char *__n;
  
  this_00 = (CodedInputStream *)&stack0xffffffffffffffd8;
  if (size < 0) {
    bVar3 = false;
  }
  else {
    if (*(int *)&this->buffer_end_ - *(int *)&this->buffer_ < size) {
      bVar3 = ReadStringFallback(this,buffer,size);
      return bVar3;
    }
    __n = (char *)(ulong)(uint)size;
    pcVar5 = __n;
    std::__cxx11::string::resize((ulong)buffer,(char)size);
    __dest = (buffer->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      ReadString((CodedInputStream *)&stack0xffffffffffffffd8);
      if (*(long *)(pcVar5 + 8) != 0) {
        pcVar5[8] = '\0';
        pcVar5[9] = '\0';
        pcVar5[10] = '\0';
        pcVar5[0xb] = '\0';
        pcVar5[0xc] = '\0';
        pcVar5[0xd] = '\0';
        pcVar5[0xe] = '\0';
        pcVar5[0xf] = '\0';
        **(undefined1 **)pcVar5 = 0;
      }
      iVar4 = this_00->current_limit_;
      if (this_00->total_bytes_limit_ < this_00->current_limit_) {
        iVar4 = this_00->total_bytes_limit_;
      }
      iVar2 = extraout_EDX;
      if ((((iVar4 != 0x7fffffff) &&
           (iVar4 = (iVar4 - this_00->total_bytes_read_) + this_00->buffer_size_after_limit_ +
                    (*(int *)&this_00->buffer_end_ - *(int *)&this_00->buffer_),
           iVar2 = extraout_EDX, extraout_EDX <= iVar4)) && (iVar2 = extraout_EDX, 0 < extraout_EDX)
          ) && (iVar2 = extraout_EDX, 0 < iVar4)) {
        std::__cxx11::string::reserve((ulong)pcVar5);
        iVar2 = extraout_EDX;
      }
      do {
        iVar4 = iVar2;
        puVar1 = this_00->buffer_;
        iVar6 = (int)this_00->buffer_end_ - (int)puVar1;
        if (iVar4 - iVar6 == 0 || iVar4 < iVar6) {
          std::__cxx11::string::append(pcVar5,(ulong)puVar1);
          this_00->buffer_ = this_00->buffer_ + iVar4;
          break;
        }
        if (iVar6 != 0) {
          std::__cxx11::string::append(pcVar5,(ulong)puVar1);
        }
        this_00->buffer_ = this_00->buffer_ + iVar6;
        bVar3 = Refresh(this_00);
        iVar2 = iVar4 - iVar6;
      } while (bVar3);
      return iVar4 <= iVar6;
    }
    memcpy(__dest,this->buffer_,(size_t)__n);
    this->buffer_ = (uint8_t *)(__n + (long)this->buffer_);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool CodedInputStream::ReadString(std::string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied

  if (BufferSize() >= size) {
    absl::strings_internal::STLStringResizeUninitialized(buffer, size);
    std::pair<char*, bool> z = as_string_data(buffer);
    if (z.second) {
      // Oddly enough, memcpy() requires its first two args to be non-NULL even
      // if we copy 0 bytes.  So, we have ensured that z.first is non-NULL here.
      ABSL_DCHECK(z.first != NULL);
      memcpy(z.first, buffer_, size);
      Advance(size);
    }
    return true;
  }

  return ReadStringFallback(buffer, size);
}